

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

xmlEntityPtr getParameterEntityDebug(void *ctx,xmlChar *name)

{
  xmlEntityPtr pxVar1;
  
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.getParameterEntity(%s)\n",name);
  pxVar1 = (xmlEntityPtr)xmlHashLookup(*(undefined8 *)((long)ctx + 0x10),name);
  return pxVar1;
}

Assistant:

static xmlEntityPtr
getParameterEntityDebug(void *ctx, const xmlChar *name)
{
    debugContext *ctxt = ctx;

    callbacks++;
    if (quiet)
	return(NULL);
    fprintf(SAXdebug, "SAX.getParameterEntity(%s)\n", name);

    return(xmlHashLookup(ctxt->parameterEntities, name));
}